

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O0

void on_underlying_ws_peer_closed
               (void *context,uint16_t *close_code,uchar *extra_data,size_t extra_data_length)

{
  LOGGER_LOG p_Var1;
  WSIO_INSTANCE *wsio_instance;
  LOGGER_LOG l;
  size_t extra_data_length_local;
  uchar *extra_data_local;
  uint16_t *close_code_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
                ,"on_underlying_ws_peer_closed",0x1a3,1,
                "NULL context for on_underlying_ws_peer_closed");
    }
  }
  else if (*(int *)((long)context + 0x40) == 0) {
    indicate_error((WSIO_INSTANCE *)context);
    *(undefined4 *)((long)context + 0x40) = 0;
  }
  else if (*(int *)((long)context + 0x40) == 1) {
    *(undefined4 *)((long)context + 0x40) = 0;
    indicate_open_complete((WSIO_INSTANCE *)context,IO_OPEN_ERROR);
  }
  else {
    indicate_error((WSIO_INSTANCE *)context);
  }
  return;
}

Assistant:

static void on_underlying_ws_peer_closed(void* context, uint16_t* close_code, const unsigned char* extra_data, size_t extra_data_length)
{
    /* Codes_SRS_WSIO_01_168: [ The close_code, extra_data and extra_data_length arguments shall be ignored. ]*/
    (void)close_code;
    (void)extra_data;
    (void)extra_data_length;

    if (context == NULL)
    {
        /* Codes_SRS_WSIO_01_167: [ If on_underlying_ws_peer_closed is called with a NULL context it shall do nothing. ]*/
        LogError("NULL context for on_underlying_ws_peer_closed");
    }
    else
    {
        WSIO_INSTANCE* wsio_instance = (WSIO_INSTANCE*)context;

        switch (wsio_instance->io_state)
        {
        default:
            /* Codes_SRS_WSIO_01_166: [ When on_underlying_ws_peer_closed and the state of the IO is OPEN an error shall be indicated by calling the on_io_error callback passed to wsio_open. ]*/
        case IO_STATE_OPEN:
            /* Codes_SRS_WSIO_01_169: [ When on_underlying_ws_peer_closed and the state of the IO is CLOSING an error shall be indicated by calling the on_io_error callback passed to wsio_open. ]*/
        case IO_STATE_CLOSING:
            indicate_error(wsio_instance);
            break;

        case IO_STATE_NOT_OPEN:
            // Codes_SRS_WSIO_07_001: [When on_underlying_ws_peer_closed and the state of the IO is NOT_OPEN an error will be raised and the io_state will remain as NOT_OPEN]
            indicate_error(wsio_instance);
            wsio_instance->io_state = IO_STATE_NOT_OPEN;
            break;

        case IO_STATE_OPENING:
            /* Codes_SRS_WSIO_01_170: [ When on_underlying_ws_peer_closed and the state of the IO is OPENING an error shall be indicated by calling the on_io_open_complete callback passed to wsio_open with the error code IO_OPEN_ERROR. ]*/
            wsio_instance->io_state = IO_STATE_NOT_OPEN;
            indicate_open_complete(wsio_instance, IO_OPEN_ERROR);
            break;
        }
    }
}